

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int on_ack_stop_sending(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,
                       quicly_sent_t *sent)

{
  quicly_stream_t *stream;
  bool bVar1;
  
  stream = quicly_get_stream((quicly_conn_t *)&map[-0x28].num_packets,(sent->data).stream.stream_id)
  ;
  if (stream != (quicly_stream_t *)0x0) {
    bVar1 = acked != 0;
    (stream->_send_aux).stop_sending.sender_state = bVar1 + 1 + (uint)bVar1;
    if (!bVar1) {
      sched_stream_control(stream);
    }
  }
  return 0;
}

Assistant:

static int on_ack_stop_sending(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_stream_t *stream;

    if ((stream = quicly_get_stream(conn, sent->data.stream_state_sender.stream_id)) != NULL) {
        on_ack_stream_state_sender(&stream->_send_aux.stop_sending.sender_state, acked);
        if (stream->_send_aux.stop_sending.sender_state != QUICLY_SENDER_STATE_ACKED)
            sched_stream_control(stream);
    }

    return 0;
}